

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  char *pcVar4;
  allocator local_1bd;
  int baud;
  RobotModel model;
  string port;
  Create robot;
  
  _model = create::RobotModel::CREATE_2;
  std::__cxx11::string::string((string *)&port,"/dev/ttyUSB0",(allocator *)&robot);
  baud = 0x1c200;
  pcVar4 = "Running driver for Create 2";
  if (1 < argc) {
    std::__cxx11::string::string((string *)&robot,argv[1],&local_1bd);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &robot,"create1");
    std::__cxx11::string::~string((string *)&robot);
    if (bVar1) {
      _model = create::RobotModel::CREATE_1;
      baud = 0xe100;
      pcVar4 = "Running driver for Create 1";
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  create::Create::Create(&robot,1);
  cVar2 = create::Create::connect((string *)&robot,(int *)&port);
  if (cVar2 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"Failed to connect to robot on port ");
    poVar3 = std::operator<<(poVar3,port._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar3);
    create::Create::~Create(&robot);
    std::__cxx11::string::~string((string *)&port);
    return 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Connected to robot");
  std::endl<char,std::char_traits<char>>(poVar3);
  do {
    create::Create::getTotalPackets();
    create::Create::getNumCorruptPackets();
    poVar3 = std::operator<<((ostream *)&std::cout,"\rTotal packets: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"  Corrupt packets: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    usleep(100000);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  while (true) {
    // Get serial packet statistics
    const uint64_t total_packets = robot.getTotalPackets();
    const uint64_t num_corrupt_packets = robot.getNumCorruptPackets();

    // Print packet stats 
    std::cout << "\rTotal packets: " << total_packets << "  Corrupt packets: " << num_corrupt_packets;

    usleep(100000);  // 10 Hz
  }

  return 0;
}